

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::minEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>
               (Matrix44<float> *A,Vec4<float> *V)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  Vec4<float> *in_RSI;
  Vec4<float> *pVVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  uint i_1;
  uint i;
  int minIdx;
  Matrix44<float> MV;
  Vec4<float> S;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff9c;
  uint i_00;
  Matrix44<float> *in_stack_ffffffffffffffa0;
  Vec4<float> local_20;
  Vec4<float> *local_10;
  
  local_10 = in_RSI;
  Vec4<float>::Vec4(&local_20);
  Matrix44<float>::Matrix44((Matrix44<float> *)&stack0xffffffffffffffa0);
  jacobiEigenSolver<float>
            (in_stack_ffffffffffffffa0,
             (Vec4<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  i_00 = 0;
  uVar6 = 1;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec4<float>::dimensions();
    if (uVar2 <= uVar6) break;
    pVVar4 = &local_20;
    Vec4<float>::operator[](pVVar4,uVar5);
    std::abs((int)pVVar4);
    pVVar4 = &local_20;
    Vec4<float>::operator[](pVVar4,i_00);
    std::abs((int)pVVar4);
    if (extraout_XMM0_Da < extraout_XMM0_Da_00) {
      i_00 = uVar5;
    }
    uVar6 = uVar5 + 1;
  }
  uVar6 = 0;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec4<float>::dimensions();
    if (uVar2 <= uVar6) break;
    pfVar3 = Matrix44<float>::operator[]((Matrix44<float> *)&stack0xffffffffffffffa0,uVar5);
    fVar1 = pfVar3[(int)i_00];
    pfVar3 = Vec4<float>::operator[](local_10,uVar5);
    *pfVar3 = fVar1;
    uVar6 = uVar5 + 1;
  }
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int minIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) < std::abs (S[minIdx])) minIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][minIdx];
}